

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool duckdb::ToCStringCastWrapper<duckdb::StringCast>::Operation<unsigned_short,duckdb_string>
               (unsigned_short input,duckdb_string *result)

{
  char *__dest;
  char *__src;
  ulong __n;
  LogicalType LStack_b8;
  string_t result_string;
  Vector result_vector;
  
  LogicalType::LogicalType(&LStack_b8,VARCHAR);
  Vector::Vector(&result_vector,&LStack_b8,(data_ptr_t)0x0);
  LogicalType::~LogicalType(&LStack_b8);
  result_string = StringCast::Operation<unsigned_short>(input,&result_vector);
  __n = (ulong)result_string.value._0_4_;
  __src = result_string.value._8_8_;
  if (result_string.value._0_4_ < 0xd) {
    __src = (char *)((long)&result_string.value + 4);
  }
  __dest = (char *)malloc(__n + 1);
  switchD_016b0717::default(__dest,__src,__n);
  __dest[__n] = '\0';
  result->data = __dest;
  result->size = __n;
  Vector::~Vector(&result_vector);
  return true;
}

Assistant:

static bool Operation(SOURCE_TYPE input, RESULT_TYPE &result) {
		Vector result_vector(LogicalType::VARCHAR, nullptr);
		auto result_string = OP::template Operation<SOURCE_TYPE>(input, result_vector);
		auto result_size = result_string.GetSize();
		auto result_data = result_string.GetData();

		char *allocated_data = char_ptr_cast(duckdb_malloc(result_size + 1));
		memcpy(allocated_data, result_data, result_size);
		allocated_data[result_size] = '\0';
		result.data = allocated_data;
		result.size = result_size;
		return true;
	}